

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void RunScript(BYTE **stream,APlayerPawn *pawn,int snum,int argn,int always)

{
  int iVar1;
  char *map;
  uint local_3c;
  int argval;
  int i;
  int arg [4];
  int always_local;
  int argn_local;
  int snum_local;
  APlayerPawn *pawn_local;
  BYTE **stream_local;
  
  arg[3] = always;
  memset(&argval,0,0x10);
  for (local_3c = 0; (int)local_3c < argn; local_3c = local_3c + 1) {
    iVar1 = ReadLong(stream);
    if (local_3c < 4) {
      (&argval)[(int)local_3c] = iVar1;
    }
  }
  map = FString::operator_cast_to_char_(&level.MapName);
  iVar1 = MIN<int>(4,argn);
  P_StartScript(&pawn->super_AActor,(line_t *)0x0,snum,map,&argval,iVar1,arg[3] | 8);
  return;
}

Assistant:

static void RunScript(BYTE **stream, APlayerPawn *pawn, int snum, int argn, int always)
{
	int arg[4] = { 0, 0, 0, 0 };
	int i;
	
	for (i = 0; i < argn; ++i)
	{
		int argval = ReadLong(stream);
		if ((unsigned)i < countof(arg))
		{
			arg[i] = argval;
		}
	}
	P_StartScript(pawn, NULL, snum, level.MapName, arg, MIN<int>(countof(arg), argn), ACS_NET | always);
}